

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# batchnorm.cpp
# Opt level: O3

int __thiscall ncnn::BatchNorm::load_model(BatchNorm *this,ModelBin *mb)

{
  int iVar1;
  int *piVar2;
  Allocator *pAVar3;
  void *pvVar4;
  void *pvVar5;
  void *pvVar6;
  void *pvVar7;
  void *pvVar8;
  void *pvVar9;
  long lVar10;
  int iVar11;
  size_t sVar12;
  float fVar13;
  float fVar14;
  undefined1 auVar15 [16];
  void *local_60;
  int *local_58;
  size_t local_50;
  Allocator *local_48;
  int local_40;
  int iStack_3c;
  int iStack_38;
  int iStack_34;
  size_t local_30;
  
  (**mb->_vptr_ModelBin)(&local_60,mb,(ulong)(uint)this->channels,1);
  if (&this->slope_data != (Mat *)&local_60) {
    if (local_58 != (int *)0x0) {
      LOCK();
      *local_58 = *local_58 + 1;
      UNLOCK();
    }
    piVar2 = (this->slope_data).refcount;
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        pvVar9 = (this->slope_data).data;
        pAVar3 = (this->slope_data).allocator;
        if (pAVar3 == (Allocator *)0x0) {
          if (pvVar9 != (void *)0x0) {
            free(*(void **)((long)pvVar9 + -8));
          }
        }
        else {
          (**(code **)(*(long *)pAVar3 + 8))();
        }
      }
    }
    (this->slope_data).data = local_60;
    (this->slope_data).refcount = local_58;
    (this->slope_data).elemsize = local_50;
    (this->slope_data).allocator = local_48;
    (this->slope_data).dims = local_40;
    (this->slope_data).w = iStack_3c;
    (this->slope_data).h = iStack_38;
    (this->slope_data).c = iStack_34;
    (this->slope_data).cstep = local_30;
  }
  if (local_58 != (int *)0x0) {
    LOCK();
    *local_58 = *local_58 + -1;
    UNLOCK();
    if (*local_58 == 0) {
      if (local_48 == (Allocator *)0x0) {
        if (local_60 != (void *)0x0) {
          free(*(void **)((long)local_60 + -8));
        }
      }
      else {
        (**(code **)(*(long *)local_48 + 8))();
      }
    }
  }
  iVar11 = -100;
  if (((this->slope_data).data != (void *)0x0) &&
     ((long)(this->slope_data).c * (this->slope_data).cstep != 0)) {
    (**mb->_vptr_ModelBin)(&local_60,mb,(ulong)(uint)this->channels,1);
    if (&this->mean_data != (Mat *)&local_60) {
      if (local_58 != (int *)0x0) {
        LOCK();
        *local_58 = *local_58 + 1;
        UNLOCK();
      }
      piVar2 = (this->mean_data).refcount;
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (*piVar2 == 0) {
          pvVar9 = (this->mean_data).data;
          pAVar3 = (this->mean_data).allocator;
          if (pAVar3 == (Allocator *)0x0) {
            if (pvVar9 != (void *)0x0) {
              free(*(void **)((long)pvVar9 + -8));
            }
          }
          else {
            (**(code **)(*(long *)pAVar3 + 8))();
          }
        }
      }
      (this->mean_data).data = local_60;
      (this->mean_data).refcount = local_58;
      (this->mean_data).elemsize = local_50;
      (this->mean_data).allocator = local_48;
      (this->mean_data).dims = local_40;
      (this->mean_data).w = iStack_3c;
      (this->mean_data).h = iStack_38;
      (this->mean_data).c = iStack_34;
      (this->mean_data).cstep = local_30;
    }
    if (local_58 != (int *)0x0) {
      LOCK();
      *local_58 = *local_58 + -1;
      UNLOCK();
      if (*local_58 == 0) {
        if (local_48 == (Allocator *)0x0) {
          if (local_60 != (void *)0x0) {
            free(*(void **)((long)local_60 + -8));
          }
        }
        else {
          (**(code **)(*(long *)local_48 + 8))();
        }
      }
    }
    if (((this->mean_data).data != (void *)0x0) &&
       ((long)(this->mean_data).c * (this->mean_data).cstep != 0)) {
      (**mb->_vptr_ModelBin)(&local_60,mb,(ulong)(uint)this->channels,1);
      if (&this->var_data != (Mat *)&local_60) {
        if (local_58 != (int *)0x0) {
          LOCK();
          *local_58 = *local_58 + 1;
          UNLOCK();
        }
        piVar2 = (this->var_data).refcount;
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + -1;
          UNLOCK();
          if (*piVar2 == 0) {
            pvVar9 = (this->var_data).data;
            pAVar3 = (this->var_data).allocator;
            if (pAVar3 == (Allocator *)0x0) {
              if (pvVar9 != (void *)0x0) {
                free(*(void **)((long)pvVar9 + -8));
              }
            }
            else {
              (**(code **)(*(long *)pAVar3 + 8))();
            }
          }
        }
        (this->var_data).data = local_60;
        (this->var_data).refcount = local_58;
        (this->var_data).elemsize = local_50;
        (this->var_data).allocator = local_48;
        (this->var_data).dims = local_40;
        (this->var_data).w = iStack_3c;
        (this->var_data).h = iStack_38;
        (this->var_data).c = iStack_34;
        (this->var_data).cstep = local_30;
      }
      if (local_58 != (int *)0x0) {
        LOCK();
        *local_58 = *local_58 + -1;
        UNLOCK();
        if (*local_58 == 0) {
          if (local_48 == (Allocator *)0x0) {
            if (local_60 != (void *)0x0) {
              free(*(void **)((long)local_60 + -8));
            }
          }
          else {
            (**(code **)(*(long *)local_48 + 8))();
          }
        }
      }
      if (((this->var_data).data != (void *)0x0) &&
         ((long)(this->var_data).c * (this->var_data).cstep != 0)) {
        (**mb->_vptr_ModelBin)(&local_60,mb,(ulong)(uint)this->channels,1);
        if (&this->bias_data != (Mat *)&local_60) {
          if (local_58 != (int *)0x0) {
            LOCK();
            *local_58 = *local_58 + 1;
            UNLOCK();
          }
          piVar2 = (this->bias_data).refcount;
          if (piVar2 != (int *)0x0) {
            LOCK();
            *piVar2 = *piVar2 + -1;
            UNLOCK();
            if (*piVar2 == 0) {
              pvVar9 = (this->bias_data).data;
              pAVar3 = (this->bias_data).allocator;
              if (pAVar3 == (Allocator *)0x0) {
                if (pvVar9 != (void *)0x0) {
                  free(*(void **)((long)pvVar9 + -8));
                }
              }
              else {
                (**(code **)(*(long *)pAVar3 + 8))();
              }
            }
          }
          (this->bias_data).data = local_60;
          (this->bias_data).refcount = local_58;
          (this->bias_data).elemsize = local_50;
          (this->bias_data).allocator = local_48;
          (this->bias_data).dims = local_40;
          (this->bias_data).w = iStack_3c;
          (this->bias_data).h = iStack_38;
          (this->bias_data).c = iStack_34;
          (this->bias_data).cstep = local_30;
        }
        if (local_58 != (int *)0x0) {
          LOCK();
          *local_58 = *local_58 + -1;
          UNLOCK();
          if (*local_58 == 0) {
            if (local_48 == (Allocator *)0x0) {
              if (local_60 != (void *)0x0) {
                free(*(void **)((long)local_60 + -8));
              }
            }
            else {
              (**(code **)(*(long *)local_48 + 8))();
            }
          }
        }
        if (((this->bias_data).data != (void *)0x0) &&
           ((long)(this->bias_data).c * (this->bias_data).cstep != 0)) {
          iVar1 = this->channels;
          if (((this->a_data).dims == 1) &&
             ((((this->a_data).w == iVar1 && ((this->a_data).elemsize == 4)) &&
              ((this->a_data).allocator == (Allocator *)0x0)))) {
            if ((this->a_data).data == (void *)0x0) {
              return -100;
            }
            sVar12 = (this->a_data).cstep;
          }
          else {
            sVar12 = (size_t)iVar1;
            piVar2 = (this->a_data).refcount;
            if (piVar2 != (int *)0x0) {
              LOCK();
              *piVar2 = *piVar2 + -1;
              UNLOCK();
              if (*piVar2 == 0) {
                pvVar9 = (this->a_data).data;
                pAVar3 = (this->a_data).allocator;
                if (pAVar3 == (Allocator *)0x0) {
                  if (pvVar9 != (void *)0x0) {
                    free(*(void **)((long)pvVar9 + -8));
                  }
                }
                else {
                  (**(code **)(*(long *)pAVar3 + 8))();
                }
              }
            }
            (this->a_data).data = (void *)0x0;
            (this->a_data).refcount = (int *)0x0;
            (this->a_data).elemsize = 4;
            (this->a_data).allocator = (Allocator *)0x0;
            (this->a_data).dims = 1;
            (this->a_data).w = iVar1;
            (this->a_data).h = 1;
            (this->a_data).c = 1;
            (this->a_data).cstep = sVar12;
            if (iVar1 == 0) {
              return -100;
            }
            pvVar9 = malloc(sVar12 * 4 + 0x1c);
            pvVar8 = (void *)((long)pvVar9 + 0x17U & 0xfffffffffffffff0);
            *(void **)((long)pvVar8 - 8) = pvVar9;
            (this->a_data).data = pvVar8;
            piVar2 = (int *)((long)pvVar8 + sVar12 * 4);
            (this->a_data).refcount = piVar2;
            *piVar2 = 1;
          }
          if ((long)(this->a_data).c * sVar12 != 0) {
            iVar1 = this->channels;
            if ((((this->b_data).dims == 1) && ((this->b_data).w == iVar1)) &&
               (((this->b_data).elemsize == 4 && ((this->b_data).allocator == (Allocator *)0x0)))) {
              pvVar9 = (this->b_data).data;
              if (pvVar9 == (void *)0x0) {
                return -100;
              }
              sVar12 = (this->b_data).cstep;
            }
            else {
              sVar12 = (size_t)iVar1;
              piVar2 = (this->b_data).refcount;
              if (piVar2 != (int *)0x0) {
                LOCK();
                *piVar2 = *piVar2 + -1;
                UNLOCK();
                if (*piVar2 == 0) {
                  pvVar9 = (this->b_data).data;
                  pAVar3 = (this->b_data).allocator;
                  if (pAVar3 == (Allocator *)0x0) {
                    if (pvVar9 != (void *)0x0) {
                      free(*(void **)((long)pvVar9 + -8));
                    }
                  }
                  else {
                    (**(code **)(*(long *)pAVar3 + 8))();
                  }
                }
              }
              (this->b_data).data = (void *)0x0;
              (this->b_data).refcount = (int *)0x0;
              (this->b_data).elemsize = 4;
              (this->b_data).allocator = (Allocator *)0x0;
              (this->b_data).dims = 1;
              (this->b_data).w = iVar1;
              (this->b_data).h = 1;
              (this->b_data).c = 1;
              (this->b_data).cstep = sVar12;
              if (iVar1 == 0) {
                return -100;
              }
              pvVar8 = malloc(sVar12 * 4 + 0x1c);
              pvVar9 = (void *)((long)pvVar8 + 0x17U & 0xfffffffffffffff0);
              *(void **)((long)pvVar9 - 8) = pvVar8;
              (this->b_data).data = pvVar9;
              piVar2 = (int *)((long)pvVar9 + sVar12 * 4);
              (this->b_data).refcount = piVar2;
              *piVar2 = 1;
            }
            if ((long)(this->b_data).c * sVar12 != 0) {
              iVar1 = this->channels;
              if ((long)iVar1 < 1) {
                iVar11 = 0;
              }
              else {
                pvVar8 = (this->var_data).data;
                pvVar4 = (this->bias_data).data;
                pvVar5 = (this->slope_data).data;
                pvVar6 = (this->mean_data).data;
                pvVar7 = (this->a_data).data;
                iVar11 = 0;
                lVar10 = 0;
                do {
                  fVar13 = this->eps + *(float *)((long)pvVar8 + lVar10 * 4);
                  auVar15 = rsqrtss(ZEXT816(0),ZEXT416((uint)fVar13));
                  fVar14 = auVar15._0_4_;
                  fVar13 = fVar14 * -0.5 * (fVar13 * fVar14 * fVar14 + -3.0);
                  *(float *)((long)pvVar7 + lVar10 * 4) =
                       *(float *)((long)pvVar4 + lVar10 * 4) -
                       *(float *)((long)pvVar6 + lVar10 * 4) * *(float *)((long)pvVar5 + lVar10 * 4)
                       * fVar13;
                  *(float *)((long)pvVar9 + lVar10 * 4) =
                       fVar13 * *(float *)((long)pvVar5 + lVar10 * 4);
                  lVar10 = lVar10 + 1;
                } while (iVar1 != lVar10);
              }
            }
          }
        }
      }
    }
  }
  return iVar11;
}

Assistant:

int BatchNorm::load_model(const ModelBin& mb)
{
    slope_data = mb.load(channels, 1);
    if (slope_data.empty())
        return -100;

    mean_data = mb.load(channels, 1);
    if (mean_data.empty())
        return -100;

    var_data = mb.load(channels, 1);
    if (var_data.empty())
        return -100;

    bias_data = mb.load(channels, 1);
    if (bias_data.empty())
        return -100;

    a_data.create(channels);
    if (a_data.empty())
        return -100;
    b_data.create(channels);
    if (b_data.empty())
        return -100;

    for (int i=0; i<channels; i++)
    {
        float sqrt_var = sqrt(var_data[i] + eps);
        a_data[i] = bias_data[i] - slope_data[i] * mean_data[i] / sqrt_var;
        b_data[i] = slope_data[i] / sqrt_var;
    }

    return 0;
}